

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O1

double __thiscall fizplex::LP::get_value(LP *this,size_t row,size_t column)

{
  ulong uVar1;
  double dVar2;
  
  uVar1 = ((long)(this->rows).
                 super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->rows).
                 super__Vector_base<fizplex::LP::Row,_std::allocator<fizplex::LP::Row>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar1 < row || uVar1 - row == 0) {
    __assert_fail("row < row_count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp.cc"
                  ,0x47,"double fizplex::LP::get_value(size_t, size_t) const");
  }
  uVar1 = ((long)(this->cols).
                 super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->cols).
                 super__Vector_base<fizplex::LP::Column,_std::allocator<fizplex::LP::Column>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (column <= uVar1 && uVar1 - column != 0) {
    dVar2 = ColMatrix::get_value(&this->A,row,column);
    return dVar2;
  }
  __assert_fail("column < column_count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp.cc",
                0x48,"double fizplex::LP::get_value(size_t, size_t) const");
}

Assistant:

double LP::get_value(size_t row, size_t column) const {
  assert(row < row_count());
  assert(column < column_count());

  return A.get_value(row, column);
}